

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
::find_non_soo<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *this,key_arg<int> *key,size_t hash)

{
  ctrl_t *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint32_t uVar4;
  ctrl_t *pcVar5;
  slot_type *psVar6;
  size_t sVar7;
  ulong extraout_RDX;
  ulong uVar8;
  ushort x;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  __m128i match;
  ctrl_t cVar11;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  undefined1 auVar12 [16];
  iterator iVar28;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_60;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  undefined1 local_38 [16];
  
  bVar3 = is_soo(this);
  if (bVar3) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe2a,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
                 );
  }
  probe(&local_60,(CommonFields *)this,hash);
  pcVar5 = control(this);
  auVar10 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar10 = pshuflw(auVar10,auVar10,0);
  uVar9 = auVar10._0_4_;
  local_38._4_4_ = uVar9;
  local_38._0_4_ = uVar9;
  local_38._8_4_ = uVar9;
  local_38._12_4_ = uVar9;
  while( true ) {
    pcVar1 = pcVar5 + local_60.offset_;
    auVar10[0] = -(local_38[0] == *pcVar1);
    auVar10[1] = -(local_38[1] == pcVar1[1]);
    auVar10[2] = -(local_38[2] == pcVar1[2]);
    auVar10[3] = -(local_38[3] == pcVar1[3]);
    auVar10[4] = -(local_38[4] == pcVar1[4]);
    auVar10[5] = -(local_38[5] == pcVar1[5]);
    auVar10[6] = -(local_38[6] == pcVar1[6]);
    auVar10[7] = -(local_38[7] == pcVar1[7]);
    auVar10[8] = -(local_38[8] == pcVar1[8]);
    auVar10[9] = -(local_38[9] == pcVar1[9]);
    auVar10[10] = -(local_38[10] == pcVar1[10]);
    auVar10[0xb] = -(local_38[0xb] == pcVar1[0xb]);
    auVar10[0xc] = -(local_38[0xc] == pcVar1[0xc]);
    auVar10[0xd] = -(local_38[0xd] == pcVar1[0xd]);
    auVar10[0xe] = -(local_38[0xe] == pcVar1[0xe]);
    auVar10[0xf] = -(local_38[0xf] == pcVar1[0xf]);
    cVar11 = *pcVar1;
    cVar13 = pcVar1[1];
    cVar14 = pcVar1[2];
    cVar15 = pcVar1[3];
    cVar16 = pcVar1[4];
    cVar17 = pcVar1[5];
    cVar18 = pcVar1[6];
    cVar19 = pcVar1[7];
    cVar20 = pcVar1[8];
    cVar21 = pcVar1[9];
    cVar22 = pcVar1[10];
    cVar23 = pcVar1[0xb];
    cVar24 = pcVar1[0xc];
    cVar25 = pcVar1[0xd];
    cVar26 = pcVar1[0xe];
    cVar27 = pcVar1[0xf];
    for (x = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf;
        x != 0; x = x - 1 & x) {
      local_48 = cVar11;
      cStack_47 = cVar13;
      cStack_46 = cVar14;
      cStack_45 = cVar15;
      cStack_44 = cVar16;
      cStack_43 = cVar17;
      cStack_42 = cVar18;
      cStack_41 = cVar19;
      cStack_40 = cVar20;
      cStack_3f = cVar21;
      cStack_3e = cVar22;
      cStack_3d = cVar23;
      cStack_3c = cVar24;
      cStack_3b = cVar25;
      cStack_3a = cVar26;
      cStack_39 = cVar27;
      uVar4 = TrailingZeros<unsigned_short>(x);
      psVar6 = slot_array(this);
      uVar8 = uVar4 + local_60.offset_ & local_60.mask_;
      if (psVar6[uVar8].value.first == *key) {
        iVar28 = iterator_at(this,uVar8);
        return iVar28;
      }
      cVar11 = local_48;
      cVar13 = cStack_47;
      cVar14 = cStack_46;
      cVar15 = cStack_45;
      cVar16 = cStack_44;
      cVar17 = cStack_43;
      cVar18 = cStack_42;
      cVar19 = cStack_41;
      cVar20 = cStack_40;
      cVar21 = cStack_3f;
      cVar22 = cStack_3e;
      cVar23 = cStack_3d;
      cVar24 = cStack_3c;
      cVar25 = cStack_3b;
      cVar26 = cStack_3a;
      cVar27 = cStack_39;
    }
    auVar12[0] = -(cVar11 == kEmpty);
    auVar12[1] = -(cVar13 == kEmpty);
    auVar12[2] = -(cVar14 == kEmpty);
    auVar12[3] = -(cVar15 == kEmpty);
    auVar12[4] = -(cVar16 == kEmpty);
    auVar12[5] = -(cVar17 == kEmpty);
    auVar12[6] = -(cVar18 == kEmpty);
    auVar12[7] = -(cVar19 == kEmpty);
    auVar12[8] = -(cVar20 == kEmpty);
    auVar12[9] = -(cVar21 == kEmpty);
    auVar12[10] = -(cVar22 == kEmpty);
    auVar12[0xb] = -(cVar23 == kEmpty);
    auVar12[0xc] = -(cVar24 == kEmpty);
    auVar12[0xd] = -(cVar25 == kEmpty);
    auVar12[0xe] = -(cVar26 == kEmpty);
    auVar12[0xf] = -(cVar27 == kEmpty);
    if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar12 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar12 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar12 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar12 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar12 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar12 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar27 == kEmpty)
    break;
    uVar8 = local_60.index_ + 0x10;
    local_60.offset_ = local_60.index_ + local_60.offset_ + 0x10 & local_60.mask_;
    local_60.index_ = uVar8;
    sVar7 = capacity(this);
    if (sVar7 < uVar8) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
                   );
    }
  }
  AssertNotDebugCapacity(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = extraout_RDX;
  return (iterator)(auVar2 << 0x40);
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }